

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

TARGET_HANDLE target_clone(TARGET_HANDLE value)

{
  TARGET_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (TARGET_HANDLE)malloc(8);
  if (__ptr != (TARGET_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (TARGET_HANDLE)0x0;
}

Assistant:

TARGET_HANDLE target_clone(TARGET_HANDLE value)
{
    TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)malloc(sizeof(TARGET_INSTANCE));
    if (target_instance != NULL)
    {
        target_instance->composite_value = amqpvalue_clone(((TARGET_INSTANCE*)value)->composite_value);
        if (target_instance->composite_value == NULL)
        {
            free(target_instance);
            target_instance = NULL;
        }
    }

    return target_instance;
}